

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

int __thiscall BpTree<int>::CanFit(BpTree<int> *this,IndexNode<int> *A,IndexNode<int> *B)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar5;
  ulong uVar6;
  IndexNode<int> local_1a8;
  IndexNode<int> local_148;
  IndexNode<int> local_e8;
  IndexNode<int> local_88;
  int iVar4;
  
  IndexNode<int>::IndexNode(&local_148,A);
  if (local_148.NodeState == '1') {
    IndexNode<int>::IndexNode(&local_88,B);
    IndexNode<int>::~IndexNode(&local_88);
    IndexNode<int>::~IndexNode(&local_148);
    if (local_88.NodeState == '1') {
      iVar1 = this->N;
      iVar4 = 1;
      if (1 < iVar1) {
        iVar4 = iVar1;
      }
      uVar3 = iVar4 - 1;
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        if ((A->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar5] != '1') goto LAB_00131994;
      }
      uVar5 = (ulong)uVar3;
LAB_00131994:
      uVar6 = 0;
      do {
        if (uVar3 == uVar6) {
LAB_001319ac:
          return (uint)((int)(uVar3 + (int)uVar5) < iVar1);
        }
        if ((B->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar6] != '1') {
          uVar3 = (uint)uVar6;
          goto LAB_001319ac;
        }
        uVar6 = uVar6 + 1;
      } while( true );
    }
  }
  else {
    IndexNode<int>::~IndexNode(&local_148);
  }
  IndexNode<int>::IndexNode(&local_1a8,A);
  if (local_1a8.NodeState == '1') {
    IndexNode<int>::~IndexNode(&local_1a8);
    uVar3 = 0;
  }
  else {
    IndexNode<int>::IndexNode(&local_e8,B);
    IndexNode<int>::~IndexNode(&local_e8);
    IndexNode<int>::~IndexNode(&local_1a8);
    uVar5 = 0;
    uVar3 = 0;
    if (local_e8.NodeState != '1') {
      uVar3 = this->N;
      uVar6 = 0;
      if (0 < (int)uVar3) {
        uVar6 = (ulong)uVar3;
      }
      for (; (uVar2 = uVar6, uVar6 != uVar5 &&
             (uVar2 = uVar5,
             (A->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar5].FileOff != -1)); uVar5 = uVar5 + 1) {
      }
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        if ((B->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar5].FileOff == -1) {
          uVar6 = uVar5 & 0xffffffff;
          break;
        }
      }
      uVar3 = (uint)((int)uVar6 + (int)uVar2 <= (int)uVar3);
    }
  }
  return uVar3;
}

Assistant:

int BpTree<K>::CanFit(IndexNode<K> A, IndexNode<K> B) {
	int i, j;
	if (this->IsLeaf(A) && this->IsLeaf(B)){
		for (i = 0; i < N - 1 && A.v[i] == '1'; i++);
		for (j = 0; j < N - 1 && B.v[j] == '1'; j++);
		return i + j <= N - 1;
	}
	else if (!this->IsLeaf(A) && !this->IsLeaf(B)) {
		for (i = 0; i < N && A.p[i].FileOff != -1; i++);
		for (j = 0; j < N && B.p[j].FileOff != -1; j++);
		return i + j <= N;
	}
	else
		return 0;
}